

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution1D::forward(Deconvolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  int *piVar9;
  void *pvVar10;
  void *pvVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Mat *pMVar16;
  ulong uVar17;
  long lVar18;
  float *pfVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  ulong uVar25;
  float *pfVar26;
  int k;
  ulong uVar27;
  ulong uVar28;
  float *pfVar29;
  int i;
  ulong uVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  Mat local_e8;
  Option *local_98;
  long local_90;
  Mat *local_88;
  Mat *local_80;
  void *local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar21 = bottom_blob->w;
  iVar2 = this->kernel_w;
  iVar3 = this->dilation_w;
  sVar8 = bottom_blob->elemsize;
  iVar4 = this->stride_w;
  iVar5 = this->output_pad_right;
  local_e8.cstep = 0;
  local_e8.data = (float *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  lVar18 = 0x10;
  if ((((this->pad_left < 1) && (this->pad_right < 1)) && (this->output_w < 1)) &&
     (lVar18 = 8, &local_e8 != top_blob)) {
    piVar9 = top_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    local_e8.data = top_blob->data;
    local_e8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_e8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_e8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_e8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_e8.elempack = top_blob->elempack;
    local_e8.allocator = top_blob->allocator;
    uVar12 = top_blob->dims;
    uVar13 = top_blob->w;
    uVar14 = top_blob->h;
    uVar15 = top_blob->d;
    local_e8.c = top_blob->c;
    local_e8.cstep = top_blob->cstep;
    local_e8.dims = uVar12;
    local_e8.w = uVar13;
    local_e8.h = uVar14;
    local_e8.d = uVar15;
  }
  local_98 = opt;
  local_88 = bottom_blob;
  Mat::create(&local_e8,iVar5 + (iVar2 + -1) * iVar3 + (iVar21 + -1) * iVar4 + 1,this->num_output,
              sVar8,*(Allocator **)(&opt->lightmode + lVar18));
  iVar21 = -100;
  if (((float *)local_e8.data != (float *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
    uVar6 = this->kernel_w;
    iVar21 = this->dilation_w;
    iVar2 = this->activation_type;
    uVar7 = local_88->h;
    local_78 = (this->bias_data).data;
    if (local_78 == (void *)0x0) {
      bVar31 = true;
    }
    else {
      bVar31 = (long)(this->bias_data).c * (this->bias_data).cstep == 0;
    }
    uVar25 = 0;
    uVar17 = 0;
    if (0 < local_e8.w) {
      uVar17 = (ulong)(uint)local_e8.w;
    }
    uVar30 = 0;
    if (0 < (int)uVar6) {
      uVar30 = (ulong)uVar6;
    }
    uVar28 = 0;
    if (0 < (int)uVar7) {
      uVar28 = (ulong)uVar7;
    }
    local_50 = (ulong)(uint)local_88->w;
    if (local_88->w < 1) {
      local_50 = uVar25;
    }
    local_68 = (ulong)(uint)local_e8.h;
    if (local_e8.h < 1) {
      local_68 = uVar25;
    }
    local_70 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
    local_90 = (long)this->stride_w << 2;
    uVar22 = 0;
    pfVar29 = (float *)local_e8.data;
    local_80 = top_blob;
    while (pMVar16 = local_80, uVar22 != local_68) {
      fVar32 = 0.0;
      if (!bVar31) {
        fVar32 = *(float *)((long)local_78 + uVar22 * 4);
      }
      for (lVar18 = 0; (int)uVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
        pfVar29[lVar18] = fVar32;
      }
      pvVar10 = (this->weight_data).data;
      pfVar19 = pfVar29;
      for (uVar20 = 0; uVar20 != local_50; uVar20 = uVar20 + 1) {
        iVar3 = local_88->w;
        sVar8 = local_88->elemsize;
        pvVar11 = local_88->data;
        pvVar23 = (void *)((long)(int)uVar25 * 4 + (long)pvVar10);
        for (uVar24 = 0; uVar24 != uVar28; uVar24 = uVar24 + 1) {
          fVar32 = *(float *)((long)pvVar11 + (long)iVar3 * sVar8 * uVar24 + uVar20 * 4);
          pfVar26 = pfVar19;
          for (uVar27 = 0; uVar30 != uVar27; uVar27 = uVar27 + 1) {
            *pfVar26 = *(float *)((long)pvVar23 + uVar27 * 4) * fVar32 + *pfVar26;
            pfVar26 = pfVar26 + iVar21;
          }
          pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar6 * 4);
        }
        pfVar19 = (float *)((long)pfVar19 + local_90);
      }
      pfVar19 = (float *)(this->activation_params).data;
      local_60 = uVar22;
      local_58 = uVar25;
      for (uVar20 = 0; uVar17 != uVar20; uVar20 = uVar20 + 1) {
        fVar32 = pfVar29[uVar20];
        fVar33 = fVar32;
        switch(iVar2) {
        case 1:
          if (fVar32 <= 0.0) {
            fVar33 = 0.0;
          }
          break;
        case 2:
          fVar33 = (float)(~-(uint)(0.0 < fVar32) & (uint)*pfVar19 |
                          -(uint)(0.0 < fVar32) & 0x3f800000) * fVar32;
          break;
        case 3:
          if (fVar32 <= *pfVar19) {
            fVar32 = *pfVar19;
          }
          fVar33 = pfVar19[1];
          if (fVar32 <= pfVar19[1]) {
            fVar33 = fVar32;
          }
          break;
        case 4:
          if (88.37626 <= fVar32) {
            fVar32 = 88.37626;
          }
          fVar32 = expf((float)(-(uint)(fVar32 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar32 < -88.37626) & (uint)-fVar32));
          fVar33 = 1.0 / (fVar32 + 1.0);
          break;
        case 5:
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0;
          local_48 = fVar32;
          fVar32 = expf(fVar32);
          fVar32 = logf(fVar32 + 1.0);
          fVar32 = tanhf(fVar32);
          fVar33 = fVar32 * local_48;
          break;
        case 6:
          fVar1 = *pfVar19;
          fVar34 = -pfVar19[1] / fVar1;
          fVar33 = 0.0;
          if ((fVar34 <= fVar32) && (fVar33 = fVar32, fVar32 <= fVar34 + 1.0 / fVar1)) {
            fVar33 = (fVar1 * fVar32 + pfVar19[1]) * fVar32;
          }
        }
        pfVar29[uVar20] = fVar33;
      }
      pfVar29 = (float *)((long)pfVar29 + local_70);
      uVar25 = (ulong)((int)local_58 + uVar7 * uVar6);
      uVar22 = local_60 + 1;
    }
    cut_padding(this,&local_e8,local_80,local_98);
    if ((pMVar16->data == (void *)0x0) || (iVar21 = 0, (long)pMVar16->c * pMVar16->cstep == 0)) {
      iVar21 = -100;
    }
  }
  piVar9 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        free(local_e8.data);
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int Deconvolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}